

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O3

void __thiscall JtagAnalyzer::Setup(JtagAnalyzer *this)

{
  char cVar1;
  AnalyzerChannelData *pAVar2;
  Channel local_30 [16];
  
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mTms = pAVar2;
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mTck = pAVar2;
  Channel::Channel(local_30,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar1 = Channel::operator!=(&(this->mSettings).mTdiChannel,local_30);
  Channel::~Channel(local_30);
  if (cVar1 == '\0') {
    pAVar2 = (AnalyzerChannelData *)0x0;
  }
  else {
    pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  }
  this->mTdi = pAVar2;
  Channel::Channel(local_30,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar1 = Channel::operator!=(&(this->mSettings).mTdoChannel,local_30);
  Channel::~Channel(local_30);
  if (cVar1 == '\0') {
    pAVar2 = (AnalyzerChannelData *)0x0;
  }
  else {
    pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  }
  this->mTdo = pAVar2;
  Channel::Channel(local_30,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar1 = Channel::operator!=(&(this->mSettings).mTrstChannel,local_30);
  Channel::~Channel(local_30);
  if (cVar1 == '\0') {
    pAVar2 = (AnalyzerChannelData *)0x0;
  }
  else {
    pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  }
  this->mTrst = pAVar2;
  return;
}

Assistant:

void JtagAnalyzer::Setup()
{
    // get the channel data pointers
    mTms = GetAnalyzerChannelData( mSettings.mTmsChannel );
    mTck = GetAnalyzerChannelData( mSettings.mTckChannel );
    if( mSettings.mTdiChannel != UNDEFINED_CHANNEL )
        mTdi = GetAnalyzerChannelData( mSettings.mTdiChannel );
    else
        mTdi = NULL;

    if( mSettings.mTdoChannel != UNDEFINED_CHANNEL )
        mTdo = GetAnalyzerChannelData( mSettings.mTdoChannel );
    else
        mTdo = NULL;

    if( mSettings.mTrstChannel != UNDEFINED_CHANNEL )
        mTrst = GetAnalyzerChannelData( mSettings.mTrstChannel );
    else
        mTrst = NULL;
}